

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

bool __thiscall
caffe::SPPParameter::MergePartialFromCodedStream(SPPParameter *this,CodedInputStream *input)

{
  InternalMetadataWithArena *this_00;
  byte bVar1;
  byte *pbVar2;
  void *pvVar3;
  bool bVar4;
  uint32 uVar5;
  uint uVar6;
  int64 iVar7;
  UnknownFieldSet *pUVar8;
  char cVar9;
  uint uVar10;
  ulong uVar11;
  
  this_00 = &this->_internal_metadata_;
LAB_003b1e9d:
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003b1ec1;
      input->buffer_ = pbVar2 + 1;
      uVar11 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003b1ec1:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar11 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar5 | uVar11;
    }
    uVar10 = (uint)uVar11;
    if ((uVar11 & 0x100000000) == 0) goto LAB_003b1ee3;
    uVar6 = (uint)(uVar11 >> 3) & 0x1fffffff;
    cVar9 = (char)uVar11;
    if (uVar6 == 6) {
      if (cVar9 != '0') goto LAB_003b1ee3;
      pbVar2 = input->buffer_;
      if (pbVar2 < input->buffer_end_) {
        bVar1 = *pbVar2;
        uVar5 = (uint32)bVar1;
        uVar10 = (uint)bVar1;
        if ((char)bVar1 < '\0') goto LAB_003b200f;
        input->buffer_ = pbVar2 + 1;
      }
      else {
        uVar5 = 0;
LAB_003b200f:
        iVar7 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
        uVar10 = (uint)iVar7;
        if (iVar7 < 0) {
          return false;
        }
      }
      if (uVar10 < 3) {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
        this->engine_ = uVar10;
      }
      else {
        pvVar3 = (this_00->
                 super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 ).ptr_;
        if (((ulong)pvVar3 & 1) == 0) {
          pUVar8 = google::protobuf::internal::
                   InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   ::mutable_unknown_fields_slow
                             (&this_00->
                               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                             );
        }
        else {
          pUVar8 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
        }
        google::protobuf::UnknownFieldSet::AddVarint(pUVar8,6,(long)(int)uVar10);
      }
      goto LAB_003b1e9d;
    }
    if (uVar6 == 2) {
      if (cVar9 == '\x10') {
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar5 = (uint32)bVar1;
          uVar10 = (uint)bVar1;
          if ((char)bVar1 < '\0') goto LAB_003b1fc4;
          input->buffer_ = pbVar2 + 1;
        }
        else {
          uVar5 = 0;
LAB_003b1fc4:
          iVar7 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
          uVar10 = (uint)iVar7;
          if (iVar7 < 0) {
            return false;
          }
        }
        if (uVar10 < 3) {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          this->pool_ = uVar10;
        }
        else {
          pvVar3 = (this_00->
                   super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   ).ptr_;
          if (((ulong)pvVar3 & 1) == 0) {
            pUVar8 = google::protobuf::internal::
                     InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                     ::mutable_unknown_fields_slow
                               (&this_00->
                                 super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                               );
          }
          else {
            pUVar8 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
          }
          google::protobuf::UnknownFieldSet::AddVarint(pUVar8,2,(long)(int)uVar10);
        }
        goto LAB_003b1e9d;
      }
    }
    else if ((uVar6 == 1) && (cVar9 == '\b')) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      pbVar2 = input->buffer_;
      if (pbVar2 < input->buffer_end_) {
        bVar1 = *pbVar2;
        uVar5 = (uint32)bVar1;
        if (-1 < (char)bVar1) {
          this->pyramid_height_ = (uint)bVar1;
          input->buffer_ = pbVar2 + 1;
          goto LAB_003b1e9d;
        }
      }
      else {
        uVar5 = 0;
      }
      iVar7 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
      this->pyramid_height_ = (uint32)iVar7;
      if (iVar7 < 0) {
        return false;
      }
      goto LAB_003b1e9d;
    }
LAB_003b1ee3:
    if (uVar10 == 0) {
      return true;
    }
    if ((uVar10 & 7) == 4) {
      return true;
    }
    pvVar3 = (this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_;
    if (((ulong)pvVar3 & 1) == 0) {
      pUVar8 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&this_00->
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
    }
    else {
      pUVar8 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
    }
    bVar4 = google::protobuf::internal::WireFormat::SkipField(input,uVar10,pUVar8);
    if (!bVar4) {
      return false;
    }
  } while( true );
}

Assistant:

bool SPPParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.SPPParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional uint32 pyramid_height = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          set_has_pyramid_height();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &pyramid_height_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.SPPParameter.PoolMethod pool = 2 [default = MAX];
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::caffe::SPPParameter_PoolMethod_IsValid(value)) {
            set_pool(static_cast< ::caffe::SPPParameter_PoolMethod >(value));
          } else {
            mutable_unknown_fields()->AddVarint(2, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.SPPParameter.Engine engine = 6 [default = DEFAULT];
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(48u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::caffe::SPPParameter_Engine_IsValid(value)) {
            set_engine(static_cast< ::caffe::SPPParameter_Engine >(value));
          } else {
            mutable_unknown_fields()->AddVarint(6, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.SPPParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.SPPParameter)
  return false;
#undef DO_
}